

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dthinker.cpp
# Opt level: O3

int AF_DThinkerIterator_Reinit
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  PClass *pPVar1;
  PClass *pPVar2;
  DThinker *pDVar3;
  undefined8 *puVar4;
  char *__assertion;
  bool bVar5;
  
  pPVar1 = DThinkerIterator::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_00383848;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    puVar4 = (undefined8 *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (puVar4 != (undefined8 *)0x0) {
        pPVar2 = (PClass *)puVar4[1];
        if (pPVar2 == (PClass *)0x0) {
          pPVar2 = (PClass *)(**(code **)*puVar4)(puVar4);
          puVar4[1] = pPVar2;
        }
        bVar5 = pPVar2 != (PClass *)0x0;
        if (pPVar2 != pPVar1 && bVar5) {
          do {
            pPVar2 = pPVar2->ParentClass;
            bVar5 = pPVar2 != (PClass *)0x0;
            if (pPVar2 == pPVar1) break;
          } while (pPVar2 != (PClass *)0x0);
        }
        if (!bVar5) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(DThinkerIterator))";
          goto LAB_00383848;
        }
        goto LAB_00383812;
      }
    }
    else if (puVar4 != (undefined8 *)0x0) goto LAB_00383838;
    puVar4 = (undefined8 *)0x0;
LAB_00383812:
    pDVar3 = FThinkerList::GetHead(DThinker::Thinkers + *(byte *)(puVar4 + 7));
    puVar4[6] = pDVar3;
    *(undefined1 *)((long)puVar4 + 0x3a) = 0;
    return 0;
  }
LAB_00383838:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_00383848:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dthinker.cpp"
                ,0x2de,
                "int AF_DThinkerIterator_Reinit(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(DThinkerIterator, Reinit)
{
	PARAM_SELF_PROLOGUE(DThinkerIterator);
	self->Reinit();
	return 0;
}